

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcre2_compile.c
# Opt level: O2

uint add_to_class_internal
               (uint8_t *classbits,PCRE2_UCHAR16 **uchardptr,uint32_t options,compile_block_16 *cb,
               uint32_t start,uint32_t end)

{
  PCRE2_UCHAR16 *pPVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  PCRE2_UCHAR16 *pPVar5;
  PCRE2_UCHAR16 PVar6;
  uint uVar7;
  uint uVar8;
  
  uVar8 = 0xff;
  if (end < 0xff) {
    uVar8 = end;
  }
  uVar2 = 0;
  if ((options & 8) != 0) {
    uVar2 = 0;
    for (uVar4 = (ulong)start; uVar4 <= uVar8; uVar4 = uVar4 + 1) {
      classbits[cb->fcc[uVar4] >> 3] =
           classbits[cb->fcc[uVar4] >> 3] | '\x01' << (cb->fcc[uVar4] & 7);
      uVar2 = uVar2 + 1;
    }
  }
  uVar3 = 0xffff;
  if (end < 0xffff) {
    uVar3 = end;
  }
  if ((options >> 0x13 & 1) != 0) {
    uVar3 = end;
  }
  uVar7 = start;
  if ((start <= cb->class_range_start) || (cb->class_range_end <= uVar3)) {
    for (; uVar7 <= uVar8; uVar7 = uVar7 + 1) {
      classbits[uVar7 >> 3] = classbits[uVar7 >> 3] | (byte)(1 << ((byte)uVar7 & 7));
      uVar2 = uVar2 + 1;
    }
    uVar8 = 0x100;
    if (0x100 < start) {
      uVar8 = start;
    }
    if (uVar8 <= uVar3) {
      pPVar1 = *uchardptr;
      if (uVar8 < uVar3) {
        pPVar5 = pPVar1 + 3;
        pPVar1[2] = (PCRE2_UCHAR16)uVar3;
        PVar6 = 2;
      }
      else {
        pPVar5 = pPVar1 + 2;
        PVar6 = 1;
      }
      *pPVar1 = PVar6;
      pPVar1[1] = (PCRE2_UCHAR16)uVar8;
      *uchardptr = pPVar5;
    }
  }
  return uVar2;
}

Assistant:

static unsigned int
add_to_class_internal(uint8_t *classbits, PCRE2_UCHAR **uchardptr,
  uint32_t options, compile_block *cb, uint32_t start, uint32_t end)
{
uint32_t c;
uint32_t classbits_end = (end <= 0xff ? end : 0xff);
unsigned int n8 = 0;

/* If caseless matching is required, scan the range and process alternate
cases. In Unicode, there are 8-bit characters that have alternate cases that
are greater than 255 and vice-versa. Sometimes we can just extend the original
range. */

if ((options & PCRE2_CASELESS) != 0)
  {
#ifdef SUPPORT_UNICODE
  if ((options & PCRE2_UTF) != 0)
    {
    int rc;
    uint32_t oc, od;

    options &= ~PCRE2_CASELESS;   /* Remove for recursive calls */
    c = start;

    while ((rc = get_othercase_range(&c, end, &oc, &od)) >= 0)
      {
      /* Handle a single character that has more than one other case. */

      if (rc > 0) n8 += add_list_to_class_internal(classbits, uchardptr, options, cb,
        PRIV(ucd_caseless_sets) + rc, oc);

      /* Do nothing if the other case range is within the original range. */

      else if (oc >= cb->class_range_start && od <= cb->class_range_end) continue;

      /* Extend the original range if there is overlap, noting that if oc < c, we
      can't have od > end because a subrange is always shorter than the basic
      range. Otherwise, use a recursive call to add the additional range. */

      else if (oc < start && od >= start - 1) start = oc; /* Extend downwards */
      else if (od > end && oc <= end + 1)
        {
        end = od;       /* Extend upwards */
        if (end > classbits_end) classbits_end = (end <= 0xff ? end : 0xff);
        }
      else n8 += add_to_class_internal(classbits, uchardptr, options, cb, oc, od);
      }
    }
  else
#endif  /* SUPPORT_UNICODE */

  /* Not UTF mode */

  for (c = start; c <= classbits_end; c++)
    {
    SETBIT(classbits, cb->fcc[c]);
    n8++;
    }
  }

/* Now handle the originally supplied range. Adjust the final value according
to the bit length - this means that the same lists of (e.g.) horizontal spaces
can be used in all cases. */

if ((options & PCRE2_UTF) == 0 && end > MAX_NON_UTF_CHAR)
  end = MAX_NON_UTF_CHAR;

if (start > cb->class_range_start && end < cb->class_range_end) return n8;

/* Use the bitmap for characters < 256. Otherwise use extra data.*/

for (c = start; c <= classbits_end; c++)
  {
  /* Regardless of start, c will always be <= 255. */
  SETBIT(classbits, c);
  n8++;
  }

#ifdef SUPPORT_WIDE_CHARS
if (start <= 0xff) start = 0xff + 1;

if (end >= start)
  {
  PCRE2_UCHAR *uchardata = *uchardptr;

#ifdef SUPPORT_UNICODE
  if ((options & PCRE2_UTF) != 0)
    {
    if (start < end)
      {
      *uchardata++ = XCL_RANGE;
      uchardata += PRIV(ord2utf)(start, uchardata);
      uchardata += PRIV(ord2utf)(end, uchardata);
      }
    else if (start == end)
      {
      *uchardata++ = XCL_SINGLE;
      uchardata += PRIV(ord2utf)(start, uchardata);
      }
    }
  else
#endif  /* SUPPORT_UNICODE */

  /* Without UTF support, character values are constrained by the bit length,
  and can only be > 256 for 16-bit and 32-bit libraries. */

#if PCRE2_CODE_UNIT_WIDTH == 8
    {}
#else
  if (start < end)
    {
    *uchardata++ = XCL_RANGE;
    *uchardata++ = start;
    *uchardata++ = end;
    }
  else if (start == end)
    {
    *uchardata++ = XCL_SINGLE;
    *uchardata++ = start;
    }
#endif  /* PCRE2_CODE_UNIT_WIDTH == 8 */
  *uchardptr = uchardata;   /* Updata extra data pointer */
  }
#else  /* SUPPORT_WIDE_CHARS */
  (void)uchardptr;          /* Avoid compiler warning */
#endif /* SUPPORT_WIDE_CHARS */

return n8;    /* Number of 8-bit characters */
}